

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joystick.hpp
# Opt level: O1

void __thiscall Inputs::ConcreteJoystick::~ConcreteJoystick(ConcreteJoystick *this)

{
  pointer pSVar1;
  pointer pIVar2;
  
  (this->super_Joystick)._vptr_Joystick = (_func_int **)&PTR__ConcreteJoystick_00598958;
  pSVar1 = (this->stick_types_).
           super__Vector_base<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->stick_types_).
                                 super__Vector_base<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  pIVar2 = (this->inputs_).
           super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar2 != (pointer)0x0) {
    operator_delete(pIVar2,(long)(this->inputs_).
                                 super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar2);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

ConcreteJoystick(const std::vector<Input> &inputs) : inputs_(inputs) {
			// Size and populate stick_types_, which is used for digital <-> analogue conversion.
			for(const auto &input: inputs_) {
				const bool is_digital_axis = input.is_digital_axis();
				const bool is_analogue_axis = input.is_analogue_axis();
				if(is_digital_axis || is_analogue_axis) {
					const size_t required_size = size_t(input.info.control.index+1);
					if(stick_types_.size() < required_size) {
						stick_types_.resize(required_size);
					}
					stick_types_[size_t(input.info.control.index)] = is_digital_axis ? StickType::Digital : StickType::Analogue;
				}
			}
		}